

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::ExtPubkey::ExtPubkey
          (ExtPubkey *this,NetType network_type,Pubkey *parent_key,ByteData256 *parent_chain_code,
          uint8_t parent_depth,uint32_t child_num,Bip32FormatType format_type)

{
  ByteData256 tweak_sum;
  uint32_t version;
  undefined8 in_stack_fffffffffffffe88;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  Extkey local_150;
  Extkey local_c0;
  
  version = ConvertToExtkeyVersion(network_type,format_type,false);
  ByteData256::ByteData256((ByteData256 *)&local_168);
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe88;
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_168;
  tweak_sum.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  Extkey::FromPubkey(&local_150,version,(ByteData *)kEmptyFingerprint,parent_key,parent_chain_code,
                     parent_depth,0,tweak_sum);
  Extkey::Derive(&local_c0,&local_150,child_num);
  Extkey::Extkey(&this->super_Extkey,&local_c0);
  Extkey::~Extkey(&local_c0);
  Extkey::~Extkey(&local_150);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_168);
  return;
}

Assistant:

ExtPubkey::ExtPubkey(
    NetType network_type, const Pubkey& parent_key,
    const ByteData256& parent_chain_code, uint8_t parent_depth,
    uint32_t child_num, Bip32FormatType format_type)
    : Extkey(Extkey::FromPubkey(
                 ConvertToExtkeyVersion(network_type, format_type, false),
                 kEmptyFingerprint, parent_key, parent_chain_code,
                 parent_depth, 0)
                 .Derive(child_num)) {
  // do nothing
}